

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildDescription.cpp
# Opt level: O3

Target * __thiscall
llbuild::buildsystem::BuildDescription::addTarget
          (BuildDescription *this,
          unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
          *value)

{
  Target *pTVar1;
  long lVar2;
  Target *pTVar3;
  Target *__ptr;
  StringRef Key;
  pair<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_bool>
  pVar4;
  
  pTVar1 = (value->_M_t).
           super___uniq_ptr_impl<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::buildsystem::Target_*,_std::default_delete<llbuild::buildsystem::Target>_>
           .super__Head_base<0UL,_llbuild::buildsystem::Target_*,_false>._M_head_impl;
  Key.Data = (pTVar1->name)._M_dataplus._M_p;
  Key.Length = (pTVar1->name)._M_string_length;
  pVar4 = llvm::
          StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
          ::try_emplace<>(&this->targets,Key);
  lVar2 = *(long *)pVar4.first.
                   super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
                   .Ptr.
                   super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
  ;
  pTVar3 = (value->_M_t).
           super___uniq_ptr_impl<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::buildsystem::Target_*,_std::default_delete<llbuild::buildsystem::Target>_>
           .super__Head_base<0UL,_llbuild::buildsystem::Target_*,_false>._M_head_impl;
  (value->_M_t).
  super___uniq_ptr_impl<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
  ._M_t.
  super__Tuple_impl<0UL,_llbuild::buildsystem::Target_*,_std::default_delete<llbuild::buildsystem::Target>_>
  .super__Head_base<0UL,_llbuild::buildsystem::Target_*,_false>._M_head_impl = (Target *)0x0;
  __ptr = *(Target **)(lVar2 + 8);
  *(Target **)(lVar2 + 8) = pTVar3;
  if (__ptr != (Target *)0x0) {
    std::default_delete<llbuild::buildsystem::Target>::operator()
              ((default_delete<llbuild::buildsystem::Target> *)(lVar2 + 8),__ptr);
  }
  return pTVar1;
}

Assistant:

Target& BuildDescription::addTarget(std::unique_ptr<Target> value) {
  auto& result = *value.get();
  getTargets()[value->getName()] = std::move(value);
  return result;
}